

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_prng.cpp
# Opt level: O0

void __thiscall Kumu::FortunaRNG::FortunaRNG(FortunaRNG *this)

{
  h__RNG *this_00;
  FortunaRNG *this_local;
  
  if (s_RNG == (h__RNG *)0x0) {
    this_00 = (h__RNG *)operator_new(0xe8);
    anon_unknown.dwarf_1b0f2::h__RNG::h__RNG(this_00);
    s_RNG = this_00;
  }
  return;
}

Assistant:

Kumu::FortunaRNG::FortunaRNG()
{
  if ( s_RNG == 0 )
    s_RNG = new h__RNG;
}